

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::Test_TemplateDictionary_SetEscapedFormattedValue::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  bool bVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  TemplateString local_230;
  TemplateString local_210;
  TemplateString local_1f0;
  TemplateString local_1d0;
  TemplateString local_1b0;
  TemplateString local_190;
  TemplateString local_170;
  TemplateString local_150;
  TemplateString local_130;
  TemplateString local_110;
  TemplateString local_f0;
  TemplateString local_d0;
  TemplateDictionaryPeer local_a0;
  TemplateDictionaryPeer peer;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"test_SetEscapedFormattedValue")
  ;
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&peer,(UnsafeArena *)0x0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_a0,local_78);
  ctemplate::TemplateString::TemplateString(&local_d0,"HTML");
  TVar1.length_._0_4_ = (int)local_d0.length_;
  TVar1.ptr_ = local_d0.ptr_;
  TVar1.length_._4_4_ = (int)(local_d0.length_ >> 0x20);
  TVar1.is_immutable_ = local_d0.is_immutable_;
  TVar1._17_3_ = local_d0._17_3_;
  TVar1._20_4_ = local_d0._20_4_;
  TVar1.id_._0_4_ = (undefined4)local_d0.id_;
  TVar1.id_._4_4_ = local_d0.id_._4_4_;
  ctemplate::TemplateDictionary::SetEscapedFormattedValue
            (TVar1,(TemplateModifier *)local_78,(char *)&ctemplate::html_escape,0x55555555,
             "This is <%s> #%.4f","a & b",in_R8,in_R9);
  ctemplate::TemplateString::TemplateString(&local_f0,"PRE");
  TVar2.length_._0_4_ = (int)local_f0.length_;
  TVar2.ptr_ = local_f0.ptr_;
  TVar2.length_._4_4_ = (int)(local_f0.length_ >> 0x20);
  TVar2.is_immutable_ = local_f0.is_immutable_;
  TVar2._17_3_ = local_f0._17_3_;
  TVar2._20_4_ = local_f0._20_4_;
  TVar2.id_._0_4_ = (undefined4)local_f0.id_;
  TVar2.id_._4_4_ = local_f0.id_._4_4_;
  ctemplate::TemplateDictionary::SetEscapedFormattedValue
            (TVar2,(TemplateModifier *)local_78,(char *)&ctemplate::pre_escape,0x55555555,
             "if %s x = %.4f;","(a < 1 && b > 2)\n\t",in_R8,in_R9);
  ctemplate::TemplateString::TemplateString(&local_110,"URL");
  TVar3.ptr_._4_4_ = local_110.ptr_._4_4_;
  TVar3.ptr_._0_4_ = local_110.ptr_._0_4_;
  TVar3.length_._0_4_ = (undefined4)local_110.length_;
  TVar3.length_._4_4_ = local_110.length_._4_4_;
  TVar3.is_immutable_ = local_110.is_immutable_;
  TVar3._17_3_ = local_110._17_3_;
  TVar3._20_4_ = local_110._20_4_;
  TVar3.id_._0_4_ = (undefined4)local_110.id_;
  TVar3.id_._4_4_ = local_110.id_._4_4_;
  ctemplate::TemplateDictionary::SetEscapedFormattedValue
            (TVar3,(TemplateModifier *)local_78,(char *)&ctemplate::url_query_escape,"pageviews-%s",
             "r?egex",in_R8,in_R9);
  ctemplate::TemplateString::TemplateString(&local_130,"XML");
  TVar4.ptr_._4_4_ = local_130.ptr_._4_4_;
  TVar4.ptr_._0_4_ = local_130.ptr_._0_4_;
  TVar4.length_._0_4_ = (undefined4)local_130.length_;
  TVar4.length_._4_4_ = local_130.length_._4_4_;
  TVar4.is_immutable_ = local_130.is_immutable_;
  TVar4._17_3_ = local_130._17_3_;
  TVar4._20_4_ = local_130._20_4_;
  TVar4.id_._0_4_ = (undefined4)local_130.id_;
  TVar4.id_._4_4_ = local_130.id_._4_4_;
  ctemplate::TemplateDictionary::SetEscapedFormattedValue
            (TVar4,(TemplateModifier *)local_78,(char *)&ctemplate::xml_escape,"This&is%s -- ok?",
             "just&",in_R8,in_R9);
  ctemplate::TemplateString::TemplateString(&local_150,"HTML");
  ctemplate::TemplateString::TemplateString(&local_170,"This is &lt;a &amp; b&gt; #0.3333");
  bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_150,&local_170);
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "peer.ValueIs(\"HTML\", \"This is &lt;a &amp; b&gt; #0.3333\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_190,"PRE");
  ctemplate::TemplateString::TemplateString
            (&local_1b0,"if (a &lt; 1 &amp;&amp; b &gt; 2)\n\t x = 0.3333;");
  bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_190,&local_1b0);
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "peer.ValueIs(\"PRE\", \"if (a &lt; 1 &amp;&amp; b &gt; 2)\\n\\t x = 0.3333;\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_1d0,"URL");
  ctemplate::TemplateString::TemplateString(&local_1f0,"pageviews-r%3Fegex");
  bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_1d0,&local_1f0);
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"URL\", \"pageviews-r%3Fegex\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_210,"XML");
  ctemplate::TemplateString::TemplateString(&local_230,"This&amp;isjust&amp; -- ok?");
  bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_210,&local_230);
  if (((bVar5 ^ 0xffU) & 1) == 0) {
    ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
    return;
  }
  fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"XML\", \"This&amp;isjust&amp; -- ok?\")");
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetEscapedFormattedValue) {
  TemplateDictionary dict("test_SetEscapedFormattedValue", NULL);
  TemplateDictionaryPeer peer(&dict);

  dict.SetEscapedFormattedValue("HTML", GOOGLE_NAMESPACE::html_escape,
                                "This is <%s> #%.4f", "a & b", 1.0/3);
  dict.SetEscapedFormattedValue("PRE", GOOGLE_NAMESPACE::pre_escape,
                                "if %s x = %.4f;", "(a < 1 && b > 2)\n\t", 1.0/3);
  dict.SetEscapedFormattedValue("URL", GOOGLE_NAMESPACE::url_query_escape,
                                "pageviews-%s", "r?egex");
  dict.SetEscapedFormattedValue("XML", GOOGLE_NAMESPACE::xml_escape,
                                "This&is%s -- ok?", "just&");

  EXPECT_TRUE(peer.ValueIs("HTML",
                           "This is &lt;a &amp; b&gt; #0.3333"));
  EXPECT_TRUE(peer.ValueIs("PRE",
                           "if (a &lt; 1 &amp;&amp; b &gt; 2)\n\t x = 0.3333;"));
  EXPECT_TRUE(peer.ValueIs("URL", "pageviews-r%3Fegex"));

  EXPECT_TRUE(peer.ValueIs("XML", "This&amp;isjust&amp; -- ok?"));
}